

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

bool WindowedKeyTest<Blob<130>,unsigned_long>
               (hashfunc<unsigned_long> hash,int windowbits,bool testCollision,bool testDistribution
               ,bool drawDiagram)

{
  pfHash p_Var1;
  reference pvVar2;
  byte in_CL;
  byte in_DL;
  uint in_ESI;
  byte in_R8B;
  int i;
  Blob<130> key;
  int minbit;
  int j;
  int testcount;
  bool result;
  bool in_stack_0000005c;
  bool in_stack_0000005d;
  bool in_stack_0000005e;
  bool in_stack_0000005f;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_00000060;
  vector<unsigned_long,_std::allocator<unsigned_long>_> hashes;
  int keycount;
  int keybits;
  int in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  undefined6 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff76;
  undefined1 in_stack_ffffffffffffff77;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this;
  size_type in_stack_ffffffffffffff88;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff90;
  int local_64;
  Blob<130> local_5d;
  uint local_4c;
  uint local_48;
  int local_44;
  byte local_3d;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_30;
  uint local_18;
  undefined4 local_14;
  byte local_f;
  byte local_e;
  byte local_d;
  uint local_c;
  hashfunc local_8 [8];
  
  local_d = in_DL & 1;
  local_e = in_CL & 1;
  local_f = in_R8B & 1;
  local_14 = 0x88;
  local_18 = 1 << (in_ESI & 0x1f);
  this = &local_30;
  local_c = in_ESI;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x149fea);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  local_3d = 1;
  local_44 = 0x88;
  printf("Keyset \'Window\' - %3d-bit key, %3d-bit window - %d tests, %d keys per test\n",0x88,
         (ulong)local_c,0x88,(ulong)local_18);
  for (local_48 = 0; (int)local_48 <= local_44; local_48 = local_48 + 1) {
    local_4c = local_48;
    Blob<130>::Blob(&local_5d);
    for (local_64 = 0; local_64 < (int)local_18; local_64 = local_64 + 1) {
      Blob<130>::Blob((Blob<130> *)&stack0xffffffffffffff8b,local_64);
      Blob<130>::operator=(&local_5d,(Blob<130> *)&stack0xffffffffffffff8b);
      lrot((void *)CONCAT17(in_stack_ffffffffffffff77,
                            CONCAT16(in_stack_ffffffffffffff76,in_stack_ffffffffffffff70)),
           in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
      p_Var1 = hashfunc::operator_cast_to_function_pointer(local_8);
      pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&local_30,(long)local_64);
      (*p_Var1)(&local_5d,0x11,0,pvVar2);
    }
    printf("Window at %3d - ",(ulong)local_48);
    in_stack_ffffffffffffff77 =
         TestHashList<unsigned_long>
                   (in_stack_00000060,in_stack_0000005f,in_stack_0000005e,in_stack_0000005d,
                    in_stack_0000005c,result);
    local_3d = (local_3d & 1 & in_stack_ffffffffffffff77) != 0;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(this);
  return (bool)(local_3d & 1);
}

Assistant:

bool WindowedKeyTest ( hashfunc<hashtype> hash, const int windowbits,
                       bool testCollision, bool testDistribution, bool drawDiagram )
{
  const int keybits = sizeof(keytype) * 8;
  const int keycount = 1 << windowbits;

  std::vector<hashtype> hashes;
  hashes.resize(keycount);

  bool result = true;

  int testcount = keybits;

  printf("Keyset 'Window' - %3d-bit key, %3d-bit window - %d tests, %d keys per test\n",
         keybits,windowbits,testcount,keycount);

  for(int j = 0; j <= testcount; j++)
  {
    int minbit = j;

    keytype key;

    for(int i = 0; i < keycount; i++)
    {
      key = i;
      //key = key << minbit;

      lrot(&key,sizeof(keytype),minbit);

      hash(&key,sizeof(keytype),0,&hashes[i]);
    }

    printf("Window at %3d - ",j);

    result &= TestHashList(hashes, drawDiagram, testCollision, testDistribution,
                           /* do not test high/low bits (to not clobber the screen) */
                           false, false);

    //printf("\n");
  }

  return result;
}